

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Compression anon_unknown.dwarf_c172::getCompression(string *str)

{
  bool bVar1;
  ostream *poVar2;
  invalid_argument *this;
  char *pcVar3;
  string *in_RDI;
  stringstream e;
  Compression c;
  char *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  stringstream local_198 [16];
  ostream local_188 [380];
  Compression local_c;
  string *local_8;
  
  local_8 = in_RDI;
  bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  if ((((bVar1) ||
       (bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18), bVar1)) ||
      (bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18), bVar1)) ||
     (bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18), bVar1)) {
    local_c = NO_COMPRESSION;
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    if ((bVar1) ||
       (bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18), bVar1)) {
      local_c = RLE_COMPRESSION;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      if ((bVar1) ||
         (bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18), bVar1)) {
        local_c = ZIP_COMPRESSION;
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        if ((bVar1) ||
           (bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18), bVar1)) {
          local_c = PIZ_COMPRESSION;
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          if ((bVar1) ||
             (bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18), bVar1))
          {
            local_c = PXR24_COMPRESSION;
          }
          else {
            bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
            if ((bVar1) ||
               (bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18), bVar1)
               ) {
              local_c = B44_COMPRESSION;
            }
            else {
              bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
              if ((bVar1) ||
                 (bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18),
                 bVar1)) {
                local_c = B44A_COMPRESSION;
              }
              else {
                bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
                if ((bVar1) ||
                   (bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18),
                   bVar1)) {
                  local_c = DWAA_COMPRESSION;
                }
                else {
                  bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
                  if ((!bVar1) &&
                     (bVar1 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18),
                     !bVar1)) {
                    std::__cxx11::stringstream::stringstream(local_198);
                    poVar2 = std::operator<<(local_188,"Unknown compression method \"");
                    poVar2 = std::operator<<(poVar2,local_8);
                    std::operator<<(poVar2,"\"");
                    this = (invalid_argument *)__cxa_allocate_exception(0x10);
                    std::__cxx11::stringstream::str();
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    std::invalid_argument::invalid_argument(this,pcVar3);
                    __cxa_throw(this,&std::invalid_argument::typeinfo,
                                std::invalid_argument::~invalid_argument);
                  }
                  local_c = DWAB_COMPRESSION;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_c;
}

Assistant:

Compression
getCompression (const string& str)
{
    Compression c;

    if (str == "no" || str == "none" || str == "NO" || str == "NONE")
    {
        c = NO_COMPRESSION;
    }
    else if (str == "rle" || str == "RLE")
    {
        c = RLE_COMPRESSION;
    }
    else if (str == "zip" || str == "ZIP")
    {
        c = ZIP_COMPRESSION;
    }
    else if (str == "piz" || str == "PIZ")
    {
        c = PIZ_COMPRESSION;
    }
    else if (str == "pxr24" || str == "PXR24")
    {
        c = PXR24_COMPRESSION;
    }
    else if (str == "b44" || str == "B44")
    {
        c = B44_COMPRESSION;
    }
    else if (str == "b44a" || str == "B44A")
    {
        c = B44A_COMPRESSION;
    }
    else if (str == "dwaa" || str == "DWAA")
    {
        c = DWAA_COMPRESSION;
    }
    else if (str == "dwab" || str == "DWAB")
    {
        c = DWAB_COMPRESSION;
    }
    else
    {
        std::stringstream e;
        e << "Unknown compression method \"" << str << "\"";
        throw invalid_argument(e.str().c_str());
    }

    return c;
}